

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::AsciiOperator>
               (string_t *ldata,int *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ulong *puVar1;
  sel_t *psVar2;
  byte bVar3;
  undefined1 auVar4 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  ulong uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  idx_t idx_in_entry;
  ulong uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  char *pcVar11;
  idx_t local_60;
  undefined1 local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  int *local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  ValidityMask *local_38;
  
  local_48 = result_data;
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = sel_vector->sel_vector;
      uVar9 = 0;
      do {
        uVar7 = uVar9;
        if (psVar2 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar2[uVar9];
        }
        local_58 = *(undefined1 (*) [8])&ldata[uVar7].value;
        p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar7].value.pointer.ptr;
        pcVar11 = (char *)p_Stack_50;
        if (((ulong)local_58 & 0xffffffff) < 0xd) {
          pcVar11 = local_58 + 4;
        }
        iVar6 = duckdb::Utf8Proc::Analyze
                          (pcVar11,(ulong)local_58 & 0xffffffff,(UnicodeInvalidReason *)0x0,
                           (ulong *)0x0);
        if (iVar6 == 1) {
          iVar6 = (int)*pcVar11;
        }
        else {
          local_60 = CONCAT44(local_60._4_4_,4);
          iVar6 = duckdb::Utf8Proc::UTF8ToCodepoint(pcVar11,(int *)&local_60);
        }
        local_48[uVar9] = iVar6;
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
  }
  else if (count != 0) {
    psVar2 = sel_vector->sel_vector;
    local_40 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar9 = 0;
    do {
      uVar7 = uVar9;
      if (psVar2 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar2[uVar9];
      }
      if (((local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar7 >> 6] >>
           (uVar7 & 0x3f) & 1) == 0) {
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_60 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_58,&local_60);
          p_Var5 = p_Stack_50;
          auVar4 = local_58;
          local_58 = (undefined1  [8])0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var10 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar4;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar3 = (byte)uVar9 & 0x3f;
        puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar9 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      else {
        local_58 = *(undefined1 (*) [8])&ldata[uVar7].value;
        p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar7].value.pointer.ptr;
        p_Var10 = p_Stack_50;
        if (((ulong)local_58 & 0xffffffff) < 0xd) {
          p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 4);
        }
        iVar6 = duckdb::Utf8Proc::Analyze
                          ((char *)p_Var10,(ulong)local_58 & 0xffffffff,(UnicodeInvalidReason *)0x0,
                           (ulong *)0x0);
        if (iVar6 == 1) {
          iVar6 = (int)*(char *)&p_Var10->_vptr__Sp_counted_base;
        }
        else {
          local_60 = CONCAT44(local_60._4_4_,4);
          iVar6 = duckdb::Utf8Proc::UTF8ToCodepoint((char *)p_Var10,(int *)&local_60);
        }
        local_48[uVar9] = iVar6;
      }
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}